

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O3

int createCellConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  pointer pvVar4;
  long lVar5;
  pointer pvVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  uVar3 = (ulong)(uint)header;
  pvVar4 = (coverMatrix->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 1;
  do {
    uVar3 = (ulong)(int)uVar3;
    lVar7 = 1;
    pvVar6 = pvVar4;
    do {
      iVar2 = (int)uVar3;
      iVar8 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar8 = iVar2;
      }
      lVar9 = -0x168;
      do {
        puVar1 = (ulong *)((ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8 +
                          *(long *)((long)&pvVar6[9].super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data + lVar9) +
                          (long)(iVar8 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
        lVar9 = lVar9 + 0x28;
      } while (lVar9 != 0);
      lVar7 = lVar7 + 1;
      uVar3 = uVar3 + 1;
      pvVar6 = pvVar6 + 9;
    } while (lVar7 != 10);
    lVar5 = lVar5 + 1;
    pvVar4 = pvVar4 + 0x51;
  } while (lVar5 != 10);
  return (int)uVar3;
}

Assistant:

int createCellConstraints(vector<vector<bool>> &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
        for (int column = COVER_START_INDEX; column <= SIZE; column++, header++) {
            for (int n = COVER_START_INDEX; n <= SIZE; n++) {
                int index = indexInCoverMatrix(row, column, n);
                
            coverMatrix[index][header] = true;

            }
        }
    }
    return header;
}